

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O3

ares_status_t
ares_cookie_validate
          (ares_query_t *query,ares_dns_record_t *dnsresp,ares_conn_t *conn,ares_timeval_t *now,
          ares_array_t **requeue)

{
  ares_server_t *paVar1;
  ares_dns_record_t *dnsrec;
  uint uVar2;
  undefined4 uVar3;
  ares_dns_rcode_t aVar4;
  long *plVar5;
  long *plVar6;
  ulong uVar7;
  uchar *puVar8;
  ares_cookie_t *paVar9;
  ares_status_t aVar10;
  size_t resp_cookie_len;
  size_t req_cookie_len;
  ulong local_40;
  size_t local_38;
  
  paVar1 = conn->server;
  dnsrec = query->query;
  plVar5 = (long *)ares_dns_cookie_fetch(dnsresp,&local_40);
  if (plVar5 == (long *)0x0) {
    puVar8 = ares_dns_cookie_fetch(dnsrec,&local_38);
    if (puVar8 == (uchar *)0x0) {
      return ARES_SUCCESS;
    }
    aVar4 = ares_dns_record_get_rcode(dnsresp);
    if (aVar4 == ARES_RCODE_BADCOOKIE) {
      return ARES_EBADRESP;
    }
  }
  else {
    if (local_40 - 0x29 < 0xffffffffffffffdf) {
      return ARES_EBADRESP;
    }
    plVar6 = (long *)ares_dns_cookie_fetch(dnsrec,&local_38);
    if (plVar6 == (long *)0x0) {
      return ARES_SUCCESS;
    }
    if (*plVar6 != *plVar5) {
      return ARES_EBADRESP;
    }
    if (8 < local_40) {
      (paVar1->cookie).state = ARES_COOKIE_SUPPORTED;
      (paVar1->cookie).unsupported_ts.sec = 0;
      *(undefined8 *)&(paVar1->cookie).unsupported_ts.usec = 0;
      if (*(long *)(paVar1->cookie).client == *plVar6) {
        (paVar1->cookie).server_len = local_40 - 8;
        memcpy((paVar1->cookie).server,plVar5 + 1,local_40 - 8);
      }
    }
    aVar4 = ares_dns_record_get_rcode(dnsresp);
    if (aVar4 == ARES_RCODE_BADCOOKIE) {
      uVar7 = query->cookie_try_count + 1;
      query->cookie_try_count = uVar7;
      if (2 < uVar7) {
        query->using_tcp = ARES_TRUE;
      }
      ares_requeue_query(query,now,ARES_SUCCESS,ARES_FALSE,(ares_dns_record_t *)0x0,requeue);
      return ARES_EBADRESP;
    }
  }
  aVar10 = ARES_SUCCESS;
  if (local_40 < 9) {
    paVar9 = &paVar1->cookie;
    aVar10 = ARES_SUCCESS;
    if (paVar9->state == ARES_COOKIE_GENERATED) {
      (paVar1->cookie).unsupported_ts.sec = 0;
      *(undefined8 *)&(paVar1->cookie).unsupported_ts.usec = 0;
      *(undefined8 *)((paVar1->cookie).server + 0x1c) = 0;
      (paVar1->cookie).server_len = 0;
      (paVar1->cookie).server[0xc] = '\0';
      (paVar1->cookie).server[0xd] = '\0';
      (paVar1->cookie).server[0xe] = '\0';
      (paVar1->cookie).server[0xf] = '\0';
      (paVar1->cookie).server[0x10] = '\0';
      (paVar1->cookie).server[0x11] = '\0';
      (paVar1->cookie).server[0x12] = '\0';
      (paVar1->cookie).server[0x13] = '\0';
      (paVar1->cookie).server[0x14] = '\0';
      (paVar1->cookie).server[0x15] = '\0';
      (paVar1->cookie).server[0x16] = '\0';
      (paVar1->cookie).server[0x17] = '\0';
      (paVar1->cookie).server[0x18] = '\0';
      (paVar1->cookie).server[0x19] = '\0';
      (paVar1->cookie).server[0x1a] = '\0';
      (paVar1->cookie).server[0x1b] = '\0';
      *(undefined8 *)((long)&(paVar1->cookie).client_ip.addr + 0xc) = 0;
      (paVar1->cookie).server[4] = '\0';
      (paVar1->cookie).server[5] = '\0';
      (paVar1->cookie).server[6] = '\0';
      (paVar1->cookie).server[7] = '\0';
      (paVar1->cookie).server[8] = '\0';
      (paVar1->cookie).server[9] = '\0';
      (paVar1->cookie).server[10] = '\0';
      (paVar1->cookie).server[0xb] = '\0';
      *(undefined8 *)&(paVar1->cookie).client_ip = 0;
      *(undefined8 *)((long)&(paVar1->cookie).client_ip.addr + 4) = 0;
      (paVar1->cookie).client_ts.sec = 0;
      *(undefined8 *)&(paVar1->cookie).client_ts.usec = 0;
      paVar9->state = ARES_COOKIE_INITIAL;
      paVar9->client[0] = '\0';
      paVar9->client[1] = '\0';
      paVar9->client[2] = '\0';
      paVar9->client[3] = '\0';
      *(undefined8 *)((paVar1->cookie).client + 4) = 0;
      (paVar1->cookie).state = ARES_COOKIE_UNSUPPORTED;
      uVar2 = now->usec;
      uVar3 = *(undefined4 *)&now->field_0xc;
      (paVar1->cookie).unsupported_ts.sec = now->sec;
      (paVar1->cookie).unsupported_ts.usec = uVar2;
      *(undefined4 *)&(paVar1->cookie).unsupported_ts.field_0xc = uVar3;
    }
    else if ((paVar9->state == ARES_COOKIE_SUPPORTED) &&
            (((paVar1->cookie).unsupported_ts.sec == 0 ||
             (aVar10 = ARES_EBADRESP, (paVar1->cookie).unsupported_ts.usec == 0)))) {
      uVar2 = now->usec;
      uVar3 = *(undefined4 *)&now->field_0xc;
      (paVar1->cookie).unsupported_ts.sec = now->sec;
      (paVar1->cookie).unsupported_ts.usec = uVar2;
      *(undefined4 *)&(paVar1->cookie).unsupported_ts.field_0xc = uVar3;
      aVar10 = ARES_EBADRESP;
    }
  }
  return aVar10;
}

Assistant:

ares_status_t ares_cookie_validate(ares_query_t            *query,
                                   const ares_dns_record_t *dnsresp,
                                   ares_conn_t *conn, const ares_timeval_t *now,
                                   ares_array_t **requeue)
{
  ares_server_t           *server = conn->server;
  ares_cookie_t           *cookie = &server->cookie;
  const ares_dns_record_t *dnsreq = query->query;
  const unsigned char     *resp_cookie;
  size_t                   resp_cookie_len;
  const unsigned char     *req_cookie;
  size_t                   req_cookie_len;

  resp_cookie = ares_dns_cookie_fetch(dnsresp, &resp_cookie_len);

  /* Invalid cookie length, drop */
  if (resp_cookie && (resp_cookie_len < 8 || resp_cookie_len > 40)) {
    return ARES_EBADRESP;
  }

  req_cookie = ares_dns_cookie_fetch(dnsreq, &req_cookie_len);

  /* Didn't request cookies, so we can stop evaluating */
  if (req_cookie == NULL) {
    return ARES_SUCCESS;
  }

  /* If 8-byte prefix for returned cookie doesn't match the requested cookie,
   * drop for spoofing */
  if (resp_cookie && memcmp(req_cookie, resp_cookie, 8) != 0) {
    return ARES_EBADRESP;
  }

  if (resp_cookie && resp_cookie_len > 8) {
    /* Make sure we record that we successfully received a cookie response */
    cookie->state = ARES_COOKIE_SUPPORTED;
    memset(&cookie->unsupported_ts, 0, sizeof(cookie->unsupported_ts));

    /* If client cookie hasn't been rotated, save the returned server cookie */
    if (memcmp(cookie->client, req_cookie, sizeof(cookie->client)) == 0) {
      cookie->server_len = resp_cookie_len - 8;
      memcpy(cookie->server, resp_cookie + 8, cookie->server_len);
    }
  }

  if (ares_dns_record_get_rcode(dnsresp) == ARES_RCODE_BADCOOKIE) {
    /* Illegal to return BADCOOKIE but no cookie, drop */
    if (resp_cookie == NULL) {
      return ARES_EBADRESP;
    }

    /* If we have too many attempts to send a cookie, we need to requeue as
     * tcp */
    query->cookie_try_count++;
    if (query->cookie_try_count >= COOKIE_RESEND_MAX) {
      query->using_tcp = ARES_TRUE;
    }

    /* Resend the request, hopefully it will work the next time as we should
     * have recorded a server cookie */
    ares_requeue_query(query, now, ARES_SUCCESS,
                       ARES_FALSE /* Don't increment try count */, NULL,
                       requeue);

    /* Parent needs to drop this response */
    return ARES_EBADRESP;
  }

  /* We've got a response with a server cookie, and we've done all the
   * evaluation we can, return success */
  if (resp_cookie_len > 8) {
    return ARES_SUCCESS;
  }

  if (cookie->state == ARES_COOKIE_SUPPORTED) {
    /* If we're not currently tracking an error time yet, start */
    if (!timeval_is_set(&cookie->unsupported_ts)) {
      memcpy(&cookie->unsupported_ts, now, sizeof(cookie->unsupported_ts));
    }
    /* Drop it since we expected a cookie */
    return ARES_EBADRESP;
  }

  if (cookie->state == ARES_COOKIE_GENERATED) {
    ares_cookie_clear(cookie);
    cookie->state = ARES_COOKIE_UNSUPPORTED;
    memcpy(&cookie->unsupported_ts, now, sizeof(cookie->unsupported_ts));
  }

  /* Cookie state should be UNSUPPORTED if we're here */
  return ARES_SUCCESS;
}